

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dinic_test.cpp
# Opt level: O0

void __thiscall Dinic_BenchmarkV100E10000_Test::TestBody(Dinic_BenchmarkV100E10000_Test *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int local_94;
  undefined1 local_90 [4];
  int i;
  Dinic d;
  int range;
  int m;
  int n;
  Dinic_BenchmarkV100E10000_Test *this_local;
  
  srand(1);
  d.pt.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 1000;
  Dinic::Dinic((Dinic *)local_90,100);
  for (local_94 = 0; local_94 < 30000; local_94 = local_94 + 1) {
    iVar2 = rand();
    iVar3 = rand();
    iVar1 = d.pt.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage._4_4_;
    iVar4 = rand();
    Dinic::addEdge((Dinic *)local_90,iVar2 % 100,iVar3 % 100,
                   (long)(iVar1 + iVar4 % d.pt.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                          .super__Vector_impl_data._M_end_of_storage._4_4_));
  }
  Dinic::getFlow((Dinic *)local_90,0,99);
  Dinic::~Dinic((Dinic *)local_90);
  return;
}

Assistant:

TEST(Dinic, BenchmarkV100E10000) {
    srand(1);
    int n = 100;
    int m = 30000;
    int range = 1000;
    Dinic d(n);
    rep(i, 0, m) {
        d.addEdge(rand() % n, rand() % n, range + rand() % range);
    }
    d.getFlow(0, n - 1);
}